

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O3

void ihevc_sao_edge_offset_class0_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  byte bVar1;
  char cVar2;
  char cVar3;
  UWORD8 *pUVar4;
  size_t __n;
  WORD8 *pWVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  char cVar12;
  UWORD8 au1_src_left_tmp [128];
  byte local_f8 [64];
  UWORD8 local_b8 [136];
  
  local_f8[0] = 0xff;
  local_f8[1] = 0xff;
  local_f8[2] = 0xff;
  local_f8[3] = 0xff;
  local_f8[4] = 0xff;
  local_f8[5] = 0xff;
  local_f8[6] = 0xff;
  local_f8[7] = 0xff;
  local_f8[8] = 0xff;
  local_f8[9] = 0xff;
  local_f8[10] = 0xff;
  local_f8[0xb] = 0xff;
  local_f8[0xc] = 0xff;
  local_f8[0xd] = 0xff;
  local_f8[0xe] = 0xff;
  local_f8[0xf] = 0xff;
  local_f8[0x10] = 0xff;
  local_f8[0x11] = 0xff;
  local_f8[0x12] = 0xff;
  local_f8[0x13] = 0xff;
  local_f8[0x14] = 0xff;
  local_f8[0x15] = 0xff;
  local_f8[0x16] = 0xff;
  local_f8[0x17] = 0xff;
  local_f8[0x18] = 0xff;
  local_f8[0x19] = 0xff;
  local_f8[0x1a] = 0xff;
  local_f8[0x1b] = 0xff;
  local_f8[0x1c] = 0xff;
  local_f8[0x1d] = 0xff;
  local_f8[0x1e] = 0xff;
  local_f8[0x1f] = 0xff;
  local_f8[0x20] = 0xff;
  local_f8[0x21] = 0xff;
  local_f8[0x22] = 0xff;
  local_f8[0x23] = 0xff;
  local_f8[0x24] = 0xff;
  local_f8[0x25] = 0xff;
  local_f8[0x26] = 0xff;
  local_f8[0x27] = 0xff;
  local_f8[0x28] = 0xff;
  local_f8[0x29] = 0xff;
  local_f8[0x2a] = 0xff;
  local_f8[0x2b] = 0xff;
  local_f8[0x2c] = 0xff;
  local_f8[0x2d] = 0xff;
  local_f8[0x2e] = 0xff;
  local_f8[0x2f] = 0xff;
  local_f8[0x30] = 0xff;
  local_f8[0x31] = 0xff;
  local_f8[0x32] = 0xff;
  local_f8[0x33] = 0xff;
  local_f8[0x34] = 0xff;
  local_f8[0x35] = 0xff;
  local_f8[0x36] = 0xff;
  local_f8[0x37] = 0xff;
  local_f8[0x38] = 0xff;
  local_f8[0x39] = 0xff;
  local_f8[0x3a] = 0xff;
  local_f8[0x3b] = 0xff;
  local_f8[0x3c] = 0xff;
  local_f8[0x3d] = 0xff;
  local_f8[0x3e] = 0xff;
  local_f8[0x3f] = 0xff;
  lVar8 = (long)wd;
  *pu1_src_top_left = pu1_src_top[lVar8 + -2];
  pu1_src_top_left[1] = pu1_src_top[lVar8 + -1];
  if (0 < ht) {
    pUVar4 = pu1_src + lVar8 + -1;
    uVar10 = 0;
    do {
      local_b8[uVar10 * 2] = pUVar4[-1];
      local_b8[uVar10 * 2 + 1] = *pUVar4;
      uVar10 = uVar10 + 1;
      pUVar4 = pUVar4 + src_strd;
    } while ((uint)ht != uVar10);
  }
  if (0 < wd) {
    uVar10 = 0;
    do {
      pu1_src_top[uVar10] = pu1_src[uVar10 + (long)((ht + -1) * src_strd)];
      uVar10 = uVar10 + 1;
    } while ((uint)wd != uVar10);
  }
  if (*pu1_avail == '\0') {
    local_f8[0] = 0;
    local_f8[1] = 0xff;
    local_f8[2] = 0xff;
    local_f8[3] = 0xff;
  }
  if (pu1_avail[1] == '\0') {
    local_f8[wd + -1 >> 1] = 0;
  }
  if (0 < ht) {
    uVar10 = 0;
    do {
      if (0 < wd) {
        cVar11 = pu1_src[1] != pu1_src_left[uVar10 * 2 + 1];
        if (pu1_src[1] < pu1_src_left[uVar10 * 2 + 1]) {
          cVar11 = -1;
        }
        cVar12 = *pu1_src != pu1_src_left[uVar10 * 2];
        if (*pu1_src < pu1_src_left[uVar10 * 2]) {
          cVar12 = -1;
        }
        uVar9 = 0;
        do {
          bVar1 = pu1_src[uVar9];
          uVar6 = (uint)(bVar1 != pu1_src[uVar9 + 2]);
          if (bVar1 < pu1_src[uVar9 + 2]) {
            uVar6 = 0xffffffff;
          }
          cVar3 = -(char)uVar6;
          cVar2 = cVar11;
          if ((uVar9 & 1) == 0) {
            cVar3 = cVar11;
            cVar2 = cVar12;
            cVar12 = -(char)uVar6;
          }
          cVar11 = cVar3;
          if (((uint)local_f8[uVar9 >> 1 & 0x7fffffff] &
              gi4_ihevc_table_edge_idx[(int)cVar2 + uVar6 + 2]) != 0) {
            pWVar5 = pi1_sao_offset_v;
            if ((uVar9 & 1) == 0) {
              pWVar5 = pi1_sao_offset_u;
            }
            iVar7 = (int)pWVar5[(uint)local_f8[uVar9 >> 1 & 0x7fffffff] &
                                gi4_ihevc_table_edge_idx[(int)cVar2 + uVar6 + 2]] + (uint)bVar1;
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pu1_src[uVar9] = (byte)iVar7;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)wd != uVar9);
      }
      pu1_src = pu1_src + src_strd;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)ht);
    if (0 < ht) {
      __n = 1;
      if (1 < ht * 2) {
        __n = (size_t)(uint)(ht * 2);
      }
      memcpy(pu1_src_left,local_b8,__n);
    }
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class0_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[2 * MAX_CTB_SIZE];
    WORD8 u1_sign_left_u, u1_sign_right_u;
    WORD8 u1_sign_left_v, u1_sign_right_v;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);
    bit_depth = BIT_DEPTH_CHROMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[2 * row] = pu1_src[row * src_strd + wd - 2];
        au1_src_left_tmp[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update masks based on the availability flags */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }
    if(0 == pu1_avail[1])
    {
        au1_mask[(wd - 1) >> 1] = 0;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            u1_sign_left_u = SIGN(pu1_src[0] - pu1_src_left[2 * row]);
            u1_sign_left_v = SIGN(pu1_src[1] - pu1_src_left[2 * row + 1]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                if(0 == col % 2)
                {
                    pi1_sao_offset = pi1_sao_offset_u;
                    u1_sign_right_u = SIGN(pu1_src[col] - pu1_src[col + 2]);
                    edge_idx = 2 + u1_sign_left_u + u1_sign_right_u;
                    u1_sign_left_u = -u1_sign_right_u;
                }
                else
                {
                    pi1_sao_offset = pi1_sao_offset_v;
                    u1_sign_right_v = SIGN(pu1_src[col] - pu1_src[col + 2]);
                    edge_idx = 2 + u1_sign_left_v + u1_sign_right_v;
                    u1_sign_left_v = -u1_sign_right_v;
                }

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    for(row = 0; row < 2 * ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }

}